

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

bool IsLiveAt(VmInstruction *inst,VmInstruction *point)

{
  VmBlock *pVVar1;
  bool bVar2;
  uint uVar3;
  VmInstruction **ppVVar4;
  VmValue **ppVVar5;
  uint local_5c;
  VmInstruction *pVStack_58;
  uint i_4;
  VmInstruction *curr_1;
  uint i_3;
  uint i_2;
  bool liveIn;
  VmInstruction *pVStack_40;
  uint i_1;
  VmInstruction *curr;
  uint i;
  VmBlock *pointBlock;
  VmBlock *definitionBlock;
  VmInstruction *point_local;
  VmInstruction *inst_local;
  
  pVVar1 = point->parent;
  if (pVVar1 == inst->parent) {
    bVar2 = IsAfter(inst,point);
    if (bVar2) {
      return false;
    }
    for (curr._4_4_ = 0; uVar3 = SmallArray<VmInstruction_*,_4U>::size(&pVVar1->liveOut),
        pVStack_40 = point, curr._4_4_ < uVar3; curr._4_4_ = curr._4_4_ + 1) {
      ppVVar4 = SmallArray<VmInstruction_*,_4U>::operator[](&pVVar1->liveOut,curr._4_4_);
      if (*ppVVar4 == inst) {
        return true;
      }
    }
    for (; pVStack_40 != (VmInstruction *)0x0; pVStack_40 = pVStack_40->nextSibling) {
      for (i_2 = 0; uVar3 = SmallArray<VmValue_*,_4U>::size(&pVStack_40->arguments), i_2 < uVar3;
          i_2 = i_2 + 1) {
        ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVStack_40->arguments,i_2);
        if ((VmInstruction *)*ppVVar5 == inst) {
          return true;
        }
      }
    }
  }
  else {
    bVar2 = false;
    for (curr_1._4_4_ = 0; uVar3 = SmallArray<VmInstruction_*,_4U>::size(&pVVar1->liveIn),
        curr_1._4_4_ < uVar3; curr_1._4_4_ = curr_1._4_4_ + 1) {
      ppVVar4 = SmallArray<VmInstruction_*,_4U>::operator[](&pVVar1->liveIn,curr_1._4_4_);
      if (*ppVVar4 == inst) {
        bVar2 = true;
        break;
      }
    }
    if (bVar2) {
      for (curr_1._0_4_ = 0; uVar3 = SmallArray<VmInstruction_*,_4U>::size(&pVVar1->liveOut),
          pVStack_58 = point, (uint)curr_1 < uVar3; curr_1._0_4_ = (uint)curr_1 + 1) {
        ppVVar4 = SmallArray<VmInstruction_*,_4U>::operator[](&pVVar1->liveOut,(uint)curr_1);
        if (*ppVVar4 == inst) {
          return true;
        }
      }
      for (; pVStack_58 != (VmInstruction *)0x0; pVStack_58 = pVStack_58->nextSibling) {
        for (local_5c = 0; uVar3 = SmallArray<VmValue_*,_4U>::size(&pVStack_58->arguments),
            local_5c < uVar3; local_5c = local_5c + 1) {
          ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVStack_58->arguments,local_5c);
          if ((VmInstruction *)*ppVVar5 == inst) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool IsLiveAt(VmInstruction *inst, VmInstruction *point)
{
	VmBlock *definitionBlock = inst->parent;

	VmBlock *pointBlock = point->parent;

	// If both instructions are in the same block
	if(pointBlock == definitionBlock)
	{
		// If definition is after the point, then it's not live yet
		if(IsAfter(inst, point))
			return false;

		// If definition is before the point, we must find out if it's live yet

		// If it's live-out, then it's live at point
		for(unsigned i = 0; i < pointBlock->liveOut.size(); i++)
		{
			if(pointBlock->liveOut[i] == inst)
				return true;
		}

		// Check if it's used at point or after it
		VmInstruction *curr = point;

		while(curr)
		{
			for(unsigned i = 0; i < curr->arguments.size(); i++)
			{
				if(curr->arguments[i] == inst)
					return true;
			}

			curr = curr->nextSibling;
		}
	}
	else
	{
		// If instruction is not live-in at point block then it's not live
		bool liveIn = false;

		for(unsigned i = 0; i < pointBlock->liveIn.size(); i++)
		{
			if(pointBlock->liveIn[i] == inst)
			{
				liveIn = true;
				break;
			}
		}

		if(liveIn)
		{
			// If it's live-out, then it's live at point
			for(unsigned i = 0; i < pointBlock->liveOut.size(); i++)
			{
				if(pointBlock->liveOut[i] == inst)
					return true;
			}

			// Check if it's used at point or after it
			VmInstruction *curr = point;

			while(curr)
			{
				for(unsigned i = 0; i < curr->arguments.size(); i++)
				{
					if(curr->arguments[i] == inst)
						return true;
				}

				curr = curr->nextSibling;
			}
		}
	}

	return false;
}